

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreplay.h
# Opt level: O2

base_learner * ExpReplay::expreplay_setup<(char)98,simple_label>(options_i *options,vw *all)

{
  int iVar1;
  option_group_definition *this;
  typed_option<unsigned_long> *op;
  example *peVar2;
  bool *pbVar3;
  ostream *poVar4;
  base_learner *l;
  single_learner *base;
  learner<ExpReplay::expreplay,_example> *plVar5;
  allocator local_28a;
  allocator local_289;
  free_ptr<ExpReplay::expreplay> er;
  string replay_string;
  string replay_count_string;
  string local_238 [32];
  string local_218;
  string local_1f8 [32];
  string local_1d8;
  string local_1b8;
  option_group_definition new_options;
  undefined1 local_160 [112];
  bool local_f0;
  typed_option<unsigned_long> local_c0;
  
  std::__cxx11::string::string((string *)&replay_string,"replay_",(allocator *)local_160);
  std::__cxx11::string::push_back((char)&replay_string);
  std::__cxx11::string::string((string *)&replay_count_string,(string *)&replay_string);
  std::__cxx11::string::append((char *)&replay_count_string);
  scoped_calloc_or_throw<ExpReplay::expreplay>();
  std::__cxx11::string::string((string *)&local_1b8,"Experience Replay",(allocator *)local_160);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::string((string *)&local_1d8,(string *)&replay_string);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_160,&local_1d8,
             &(er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->N);
  local_f0 = true;
  std::__cxx11::string::string
            (local_1f8,
             "use experience replay at a specified level [b=classification/regression, m=multiclass, c=cost sensitive] with specified buffer size"
             ,&local_289);
  std::__cxx11::string::_M_assign((string *)(local_160 + 0x30));
  this = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                   (&new_options,(typed_option<unsigned_long> *)local_160);
  std::__cxx11::string::string((string *)&local_218,(string *)&replay_count_string);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_c0,&local_218,
             &(er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->replay_count);
  op = VW::config::typed_option<unsigned_long>::default_value(&local_c0,1);
  std::__cxx11::string::string
            (local_238,
             "how many times (in expectation) should each example be played (default: 1 = permuting)"
             ,&local_28a);
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>(this,op);
  std::__cxx11::string::~string(local_238);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_c0);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string(local_1f8);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_160);
  std::__cxx11::string::~string((string *)&local_1d8);
  (**options->_vptr_options_i)(options,&new_options);
  iVar1 = (*options->_vptr_options_i[1])(options,&replay_string);
  if (((char)iVar1 == '\0') ||
     ((er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->N == 0)) {
    plVar5 = (learner<ExpReplay::expreplay,_example> *)0x0;
  }
  else {
    (er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->all = all;
    peVar2 = VW::alloc_examples(1,(er._M_t.
                                   super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
                                   super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl
                                  )->N);
    (er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->buf = peVar2;
    pbVar3 = calloc_or_throw<bool>
                       ((er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
                         super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
                         super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->N);
    (er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->filled = pbVar3;
    if (all->quiet == false) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"experience replay level=");
      poVar4 = std::operator<<(poVar4,'b');
      poVar4 = std::operator<<(poVar4,", buffer=");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,", replay count=");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    (er._M_t.super___uniq_ptr_impl<ExpReplay::expreplay,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_ExpReplay::expreplay_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_ExpReplay::expreplay_*,_false>._M_head_impl)->base = base;
    plVar5 = LEARNER::init_learner<ExpReplay::expreplay,example,LEARNER::learner<char,example>>
                       (&er,base,predict_or_learn<true,simple_label>,
                        predict_or_learn<false,simple_label>);
    *(undefined8 *)(plVar5 + 0xb8) = *(undefined8 *)(plVar5 + 0x18);
    *(undefined8 *)(plVar5 + 0xc0) = *(undefined8 *)(plVar5 + 0x20);
    *(code **)(plVar5 + 200) = finish<simple_label>;
    *(undefined8 *)(plVar5 + 0x88) = *(undefined8 *)(plVar5 + 0x18);
    *(undefined8 *)(plVar5 + 0x90) = *(undefined8 *)(plVar5 + 0x20);
    *(code **)(plVar5 + 0x98) = end_pass;
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::~unique_ptr(&er);
  std::__cxx11::string::~string((string *)&replay_count_string);
  std::__cxx11::string::~string((string *)&replay_string);
  return (base_learner *)plVar5;
}

Assistant:

LEARNER::base_learner* expreplay_setup(VW::config::options_i& options, vw& all)
{
  std::string replay_string = "replay_";
  replay_string += er_level;
  std::string replay_count_string = replay_string;
  replay_count_string += "_count";

  auto er = scoped_calloc_or_throw<expreplay>();
  VW::config::option_group_definition new_options("Experience Replay");
  new_options
      .add(VW::config::make_option(replay_string, er->N)
               .keep()
               .help("use experience replay at a specified level [b=classification/regression, m=multiclass, c=cost "
                     "sensitive] with specified buffer size"))
      .add(VW::config::make_option(replay_count_string, er->replay_count)
               .default_value(1)
               .help("how many times (in expectation) should each example be played (default: 1 = permuting)"));
  options.add_and_parse(new_options);

  if (!options.was_supplied(replay_string) || er->N == 0)
    return nullptr;

  er->all = &all;
  er->buf = VW::alloc_examples(1, er->N);

  if (er_level == 'c')
    for (size_t n = 0; n < er->N; n++) er->buf[n].l.cs.costs = v_init<COST_SENSITIVE::wclass>();

  er->filled = calloc_or_throw<bool>(er->N);

  if (!all.quiet)
    std::cerr << "experience replay level=" << er_level << ", buffer=" << er->N << ", replay count=" << er->replay_count
              << std::endl;

  er->base = LEARNER::as_singleline(setup_base(options, all));
  LEARNER::learner<expreplay, example>* l =
      &init_learner(er, er->base, predict_or_learn<true, lp>, predict_or_learn<false, lp>);
  l->set_finish(finish<lp>);
  l->set_end_pass(end_pass);

  return make_base(*l);
}